

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

void draw_undo(Fl_Color c)

{
  Fl_Color c_local;
  
  fl_translate(0.0,0.2);
  fl_scale(1.0,-1.0);
  draw_round_arrow(c,6.0);
  fl_scale(1.0,-1.0);
  fl_translate(0.0,-0.2);
  return;
}

Assistant:

static void draw_undo(Fl_Color c) {
  fl_translate(0.0, 0.2);
  fl_scale(1.0, -1.0);
  draw_round_arrow(c, 6);
  fl_scale(1.0, -1.0);
  fl_translate(0.0, -0.2);
}